

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha.c
# Opt level: O0

_func_uint64_t_void_ptr_size_t_uint64_t * t1ha_local_resolve(void)

{
  uint32_t uVar1;
  uint32_t features;
  _func_uint64_t_void_ptr_size_t_uint64_t *local_8;
  
  uVar1 = x86_cpu_features();
  if ((uVar1 & 0x2000000) == 0) {
    if ((uVar1 & 0x100000) == 0) {
      local_8 = t1ha_64le;
    }
    else {
      local_8 = t1ha_ia32crc;
    }
  }
  else {
    local_8 = (_func_uint64_t_void_ptr_size_t_uint64_t *)&LAB_00109530;
  }
  return local_8;
}

Assistant:

static uint64_t (*t1ha_local_resolve(void))(const void *, size_t, uint64_t) {
#if defined(__x86_64) || defined(_M_IX86) || defined(_M_X64) ||                \
    defined(i386) || defined(_X86_) || defined(__i386__) || defined(_X86_64_)

  uint32_t features = x86_cpu_features();
  if (features & (1l << 25))
    return t1ha_ia32aes;

#if defined(__x86_64) || defined(_M_X64) || defined(_X86_64_)
  if (features & (1l << 20))
    return t1ha_ia32crc;
#endif

#endif /* x86 */

#if __BYTE_ORDER__ == __ORDER_BIG_ENDIAN__
  return (sizeof(long) >= 8) ? t1ha_64be : t1ha_32be;
#else
  return (sizeof(long) >= 8) ? t1ha_64le : t1ha_32le;
#endif
}